

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall cmCacheManager::CacheIterator::SetValue(CacheIterator *this,char *value)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  
  p_Var1 = (this->Position)._M_node;
  if ((_Rb_tree_header *)p_Var1 != &(this->Container->Cache)._M_t._M_impl.super__Rb_tree_header) {
    if (value == (char *)0x0) {
      p_Var1[2]._M_parent = (_Base_ptr)0x0;
      **(undefined1 **)(p_Var1 + 2) = 0;
    }
    else {
      p_Var2 = p_Var1[2]._M_parent;
      strlen(value);
      std::__cxx11::string::_M_replace((ulong)(p_Var1 + 2),0,(char *)p_Var2,(ulong)value);
      *(undefined1 *)&p_Var1[4]._M_right = 1;
    }
  }
  return;
}

Assistant:

bool cmCacheManager::CacheIterator::IsAtEnd() const
{
  return this->Position == this->Container.Cache.end();
}